

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O3

void __thiscall
S2RegionCoverer::ReplaceCellsWithAncestor
          (S2RegionCoverer *this,vector<S2CellId,_std::allocator<S2CellId>_> *covering,S2CellId id)

{
  ulong uVar1;
  ulong uVar2;
  pointer pSVar3;
  size_t __n;
  ulong uVar4;
  ulong uVar5;
  pointer pSVar6;
  pointer pSVar7;
  pointer __src;
  S2LogMessage SStack_38;
  
  __src = (covering->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
          super__Vector_impl_data._M_start;
  pSVar3 = (covering->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar1 = (long)pSVar3 - (long)__src >> 3;
  if (0 < (long)uVar1) {
    uVar2 = ~id.id_ & id.id_ - 1;
    uVar5 = uVar1;
    pSVar7 = __src;
    do {
      uVar4 = uVar5 >> 1;
      uVar5 = ~uVar4 + uVar5;
      pSVar6 = pSVar7 + uVar4 + 1;
      if (id.id_ - uVar2 <= (pSVar7 + uVar4 + 1)[-1].id_) {
        uVar5 = uVar4;
        pSVar6 = pSVar7;
      }
      pSVar7 = pSVar6;
    } while (0 < (long)uVar5);
    do {
      uVar5 = uVar1 >> 1;
      uVar1 = ~uVar5 + uVar1;
      pSVar6 = __src + uVar5 + 1;
      if (uVar2 + id.id_ < __src[uVar5].id_) {
        uVar1 = uVar5;
        pSVar6 = __src;
      }
      __src = pSVar6;
    } while (0 < (long)uVar1);
    if (pSVar7 != __src) {
      pSVar6 = pSVar7 + 1;
      if (pSVar6 != __src) {
        __n = (long)pSVar3 - (long)__src;
        pSVar3 = __src;
        if (__n != 0) {
          memmove(pSVar6,__src,__n);
          pSVar3 = (covering->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        pSVar6 = (pointer)((long)pSVar6 + ((long)pSVar3 - (long)__src));
        if (pSVar3 != pSVar6) {
          (covering->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
          super__Vector_impl_data._M_finish = pSVar6;
        }
      }
      pSVar7->id_ = id.id_;
      return;
    }
  }
  S2LogMessage::S2LogMessage
            (&SStack_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
             ,0x194,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_38.stream_,"Check failed: begin != end ",0x1b);
  abort();
}

Assistant:

void S2RegionCoverer::ReplaceCellsWithAncestor(vector<S2CellId>* covering,
                                               S2CellId id) const {
  auto begin = std::lower_bound(covering->begin(), covering->end(),
                                id.range_min());
  auto end = std::upper_bound(covering->begin(), covering->end(),
                              id.range_max());
  S2_DCHECK(begin != end);
  covering->erase(begin + 1, end);
  *begin = id;
}